

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

Path * __thiscall kj::Path::evalWin32(Path *__return_storage_ptr__,Path *this,StringPtr pathText)

{
  size_t sVar1;
  size_t sVar2;
  String *pSVar3;
  String *params;
  Vector<kj::String> *this_00;
  size_t extraout_RDX;
  undefined1 in_R9B;
  StringPtr path;
  StringPtr path_00;
  String *p;
  String *__end1;
  String *local_68;
  String *__begin1;
  Array<kj::String> *__range1;
  undefined1 local_48 [8];
  Vector<kj::String> newParts;
  Path *this_local;
  StringPtr pathText_local;
  
  path_00.content.ptr = (char *)pathText.content.size_;
  newParts.builder.disposer = (ArrayDisposer *)this;
  sVar1 = Array<kj::String>::size(&this->parts);
  path.content.size_ = extraout_RDX;
  path.content.ptr = path_00.content.ptr;
  sVar2 = countPartsWin32((Path *)pathText.content.ptr,path);
  Vector<kj::String>::Vector((Vector<kj::String> *)local_48,sVar1 + sVar2);
  local_68 = Array<kj::String>::begin(&this->parts);
  pSVar3 = Array<kj::String>::end(&this->parts);
  for (; local_68 != pSVar3; local_68 = local_68 + 1) {
    params = mv<kj::String>(local_68);
    Vector<kj::String>::add<kj::String>((Vector<kj::String> *)local_48,params);
  }
  this_00 = mv<kj::Vector<kj::String>>((Vector<kj::String> *)local_48);
  path_00.content.size_ = 0;
  evalWin32Impl(__return_storage_ptr__,(Path *)this_00,(Vector<kj::String> *)pathText.content.ptr,
                path_00,(bool)in_R9B);
  Vector<kj::String>::~Vector((Vector<kj::String> *)local_48);
  return __return_storage_ptr__;
}

Assistant:

Path Path::evalWin32(StringPtr pathText) && {
  Vector<String> newParts(parts.size() + countPartsWin32(pathText));
  for (auto& p: parts) newParts.add(kj::mv(p));
  return evalWin32Impl(kj::mv(newParts), pathText);
}